

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

point3d * tinyusdz::vcross(point3d *__return_storage_ptr__,point3d *a,point3d *b)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  point3d *n;
  point3d *b_local;
  point3d *a_local;
  
  dVar2 = value::point3d::operator[](a,1);
  dVar3 = value::point3d::operator[](b,2);
  dVar4 = value::point3d::operator[](a,2);
  dVar5 = value::point3d::operator[](b,1);
  pdVar1 = value::point3d::operator[](__return_storage_ptr__,0);
  *pdVar1 = dVar2 * dVar3 + -(dVar4 * dVar5);
  dVar2 = value::point3d::operator[](a,2);
  dVar3 = value::point3d::operator[](b,0);
  dVar4 = value::point3d::operator[](a,0);
  dVar5 = value::point3d::operator[](b,2);
  pdVar1 = value::point3d::operator[](__return_storage_ptr__,1);
  *pdVar1 = dVar2 * dVar3 + -(dVar4 * dVar5);
  dVar2 = value::point3d::operator[](a,0);
  dVar3 = value::point3d::operator[](b,1);
  dVar4 = value::point3d::operator[](a,1);
  dVar5 = value::point3d::operator[](b,0);
  pdVar1 = value::point3d::operator[](__return_storage_ptr__,2);
  *pdVar1 = dVar2 * dVar3 + -(dVar4 * dVar5);
  return __return_storage_ptr__;
}

Assistant:

value::point3d vcross(const value::point3d &a, const value::point3d &b)
{
  value::point3d n;
  n[0] = a[1] * b[2] - a[2] * b[1];
  n[1] = a[2] * b[0] - a[0] * b[2];
  n[2] = a[0] * b[1] - a[1] * b[0];

  return n;
}